

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_nls.c
# Opt level: O3

int mriStep_NlsFPFunction(N_Vector zcor,N_Vector g,void *arkode_mem)

{
  int iVar1;
  int iVar2;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem local_20;
  ARKodeMem local_18;
  
  iVar1 = mriStep_AccessARKODEStepMem(arkode_mem,"mriStep_NlsFPFunction",&local_18,&local_20);
  if (iVar1 == 0) {
    N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,local_20->zpred,zcor,local_18->ycur);
    iVar2 = (*local_20->nls_fsi)
                      (local_18->tcur,local_18->ycur,
                       local_20->Fsi[local_20->stage_map[local_20->istage]],local_18->user_data);
    local_20->nfsi = local_20->nfsi + 1;
    if (iVar2 < 0) {
      iVar1 = -8;
    }
    else {
      iVar1 = 9;
      if (iVar2 == 0) {
        N_VLinearSum(local_20->gamma,0x3ff0000000000000,
                     local_20->Fsi[local_20->stage_map[local_20->istage]],local_20->sdata,g);
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int mriStep_NlsFPFunction(N_Vector zcor, N_Vector g, void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* compute slow implicit RHS and save for later */
  retval = step_mem->nls_fsi(ark_mem->tcur, ark_mem->ycur,
                             step_mem->Fsi[step_mem->stage_map[step_mem->istage]],
                             ark_mem->user_data);
  step_mem->nfsi++;
  if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
  if (retval > 0) { return (RHSFUNC_RECVR); }

  /* combine parts:  g = gamma*Fsi(z) + sdata */
  N_VLinearSum(step_mem->gamma,
               step_mem->Fsi[step_mem->stage_map[step_mem->istage]], ONE,
               step_mem->sdata, g);

  return (ARK_SUCCESS);
}